

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> __thiscall
cmGlobalNinjaGenerator::CreateLinkLineComputer
          (cmGlobalNinjaGenerator *this,cmOutputConverter *outputConverter,cmStateDirectory *param_2
          )

{
  cmOutputConverter *local_78;
  undefined1 local_70 [32];
  cmStateDirectory local_50;
  
  local_70._0_8_ = param_2;
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)(local_70 + 8),
             (cmLocalGenerator *)**(undefined8 **)&outputConverter[1].RelativePathTopSource.field_2)
  ;
  cmStateSnapshot::GetDirectory(&local_50,(cmStateSnapshot *)(local_70 + 8));
  std::
  make_unique<cmNinjaLinkLineComputer,cmOutputConverter*&,cmStateDirectory,cmGlobalNinjaGenerator_const*>
            (&local_78,(cmStateDirectory *)local_70,(cmGlobalNinjaGenerator **)&local_50);
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)local_78;
  return (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmLinkLineComputer>
cmGlobalNinjaGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter,
  cmStateDirectory const& /* stateDir */) const
{
  return std::unique_ptr<cmLinkLineComputer>(
    cm::make_unique<cmNinjaLinkLineComputer>(
      outputConverter,
      this->LocalGenerators[0]->GetStateSnapshot().GetDirectory(), this));
}